

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<ProStringList>::emplace<ProStringList_const&>
          (QMovableArrayOps<ProStringList> *this,qsizetype i,ProStringList *args)

{
  qsizetype *pqVar1;
  ProStringList **ppPVar2;
  Data *pDVar3;
  ProStringList *pPVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_68;
  QArrayDataPointer<ProString> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.size ==
        i) {
      qVar5 = QArrayDataPointer<ProStringList>::freeSpaceAtEnd
                        ((QArrayDataPointer<ProStringList> *)this);
      if (qVar5 == 0) goto LAB_002007a7;
      QArrayDataPointer<ProString>::QArrayDataPointer
                ((QArrayDataPointer<ProString> *)
                 ((this->super_QGenericArrayOps<ProStringList>).
                  super_QArrayDataPointer<ProStringList>.ptr +
                 (this->super_QGenericArrayOps<ProStringList>).
                 super_QArrayDataPointer<ProStringList>.size),(QArrayDataPointer<ProString> *)args);
LAB_002008de:
      pqVar1 = &(this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>
                .size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_0020089d;
    }
LAB_002007a7:
    if (i == 0) {
      qVar5 = QArrayDataPointer<ProStringList>::freeSpaceAtBegin
                        ((QArrayDataPointer<ProStringList> *)this);
      if (qVar5 != 0) {
        QArrayDataPointer<ProString>::QArrayDataPointer
                  ((QArrayDataPointer<ProString> *)
                   ((this->super_QGenericArrayOps<ProStringList>).
                    super_QArrayDataPointer<ProStringList>.ptr + -1),
                   (QArrayDataPointer<ProString> *)args);
        ppPVar2 = &(this->super_QGenericArrayOps<ProStringList>).
                   super_QArrayDataPointer<ProStringList>.ptr;
        *ppPVar2 = *ppPVar2 + -1;
        goto LAB_002008de;
      }
    }
  }
  local_40.d = (args->super_QList<ProString>).d.d;
  local_40.ptr = (args->super_QList<ProString>).d.ptr;
  local_40.size = (args->super_QList<ProString>).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar6 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.size
          != 0;
  QArrayDataPointer<ProStringList>::detachAndGrow
            ((QArrayDataPointer<ProStringList> *)this,(uint)(i == 0 && bVar6),1,
             (ProStringList **)0x0,(QArrayDataPointer<ProStringList> *)0x0);
  if (i == 0 && bVar6) {
    pPVar4 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
             ptr;
    pPVar4[-1].super_QList<ProString>.d.d = local_40.d;
    pPVar4[-1].super_QList<ProString>.d.ptr = local_40.ptr;
    pPVar4[-1].super_QList<ProString>.d.size = local_40.size;
    (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.ptr =
         pPVar4 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
              size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_68,(QArrayDataPointer<ProStringList> *)this,i,1);
    ((local_68.displaceFrom)->super_QList<ProString>).d.d = local_40.d;
    ((local_68.displaceFrom)->super_QList<ProString>).d.ptr = local_40.ptr;
    ((local_68.displaceFrom)->super_QList<ProString>).d.size = local_40.size;
    local_68.displaceFrom = local_68.displaceFrom + 1;
    (local_68.data)->size = (local_68.data)->size + local_68.nInserts;
  }
  local_40.size = 0;
  local_40.ptr = (ProString *)0x0;
  local_40.d = (Data *)0x0;
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_40);
LAB_0020089d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }